

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O0

FDoubleProd * StringToDouble(FProduction *prod)

{
  FDoubleProd *pFVar1;
  double val;
  FDoubleProd *newprod;
  FProduction *prod_local;
  
  val = atof((char *)(prod + 1));
  pFVar1 = NewDoubleProd(val);
  M_Free(prod);
  return pFVar1;
}

Assistant:

static FDoubleProd *StringToDouble (FProduction *prod)
{
	FDoubleProd *newprod;
	
	newprod = NewDoubleProd (atof (static_cast<FStringProd *>(prod)->Value));
	M_Free (prod);
	return newprod;
}